

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall imrt::ApertureILS::getShuffledApertureNeighbors(ApertureILS *this,Plan *P)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppSVar6;
  Plan *in_RDX;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *in_RDI;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar7;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar8;
  int k;
  int a;
  int s;
  pair<int,_int> active;
  pair<int,_int> pattern;
  int beamlet;
  iterator st;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *a_list;
  Collimator *in_stack_fffffffffffffdb8;
  pair<int,_int> in_stack_fffffffffffffdc0;
  pair<int,_int> __x;
  pair<int,_int> in_stack_fffffffffffffdc8;
  pair<int,_int> in_stack_fffffffffffffdd8;
  pair<int,_int> in_stack_fffffffffffffde0;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  pair<int,_int> local_88;
  pair<int,_int> local_80;
  int local_78;
  int local_74;
  int local_70;
  pair<int,_int> local_6c [2];
  pair<int,_int> local_58;
  _List_node_base *local_50;
  int local_44;
  _List_iterator<imrt::Station_*> local_40;
  undefined1 local_31;
  
  Plan::get_stations_abi_cxx11_(in_RDX);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),in_stack_fffffffffffffdf8
            );
  local_31 = 0;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            *)0x1614dc);
  std::_List_iterator<imrt::Station_*>::_List_iterator(&local_40);
  local_50 = (_List_node_base *)
             std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                       ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                        in_stack_fffffffffffffdb8);
  local_40._M_node = local_50;
  std::pair<int,_int>::pair<int,_int,_true>(&local_58);
  std::pair<int,_int>::pair<int,_int,_true>(local_6c);
  pVar8.second = in_stack_fffffffffffffdc0;
  pVar8.first = in_stack_fffffffffffffdc8;
  for (local_70 = 0; uVar4 = (ulong)local_70,
      sVar5 = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::size
                        ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)pVar8.second),
      uVar4 < sVar5; local_70 = local_70 + 1) {
    local_74 = 0;
    while( true ) {
      iVar1 = local_74;
      ppSVar6 = std::_List_iterator<imrt::Station_*>::operator*
                          ((_List_iterator<imrt::Station_*> *)pVar8.second);
      iVar3 = Station::getNbApertures(*ppSVar6);
      if (iVar3 <= iVar1) break;
      local_78 = 0;
      while( true ) {
        iVar1 = local_78;
        ppSVar6 = std::_List_iterator<imrt::Station_*>::operator*
                            ((_List_iterator<imrt::Station_*> *)pVar8.second);
        iVar3 = Collimator::getXdim((*ppSVar6)->collimator);
        if (iVar3 <= iVar1) break;
        std::_List_iterator<imrt::Station_*>::operator*
                  ((_List_iterator<imrt::Station_*> *)pVar8.second);
        local_80 = Station::getApertureShape((Station *)in_stack_fffffffffffffdb8,0,0x16162c);
        std::pair<int,_int>::operator=(&local_58,&local_80);
        std::_List_iterator<imrt::Station_*>::operator*
                  ((_List_iterator<imrt::Station_*> *)pVar8.second);
        ppSVar6 = std::_List_iterator<imrt::Station_*>::operator*
                            ((_List_iterator<imrt::Station_*> *)pVar8.second);
        Station::getAngle(*ppSVar6);
        local_88 = Collimator::getActiveRange(in_stack_fffffffffffffdb8,0,0x1616c9);
        std::pair<int,_int>::operator=(local_6c,&local_88);
        if (local_6c[0].first != -1) {
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)pVar8.second);
          std::make_pair<int&,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x161767);
          local_44 = Station::getBeamIndex((Station *)in_stack_fffffffffffffdb8,pVar8.second);
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)pVar8.second);
          bVar2 = Station::isOpenBeamlet
                            ((Station *)pVar8.first,pVar8.second.second,pVar8.second.first);
          if (bVar2) {
            std::make_pair<int&,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x1617fe);
            std::make_pair<int,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x161838);
            std::make_pair<std::pair<int,int>,std::pair<int,int>>
                      ((pair<int,_int> *)pVar8.second,(pair<int,_int> *)in_stack_fffffffffffffdb8);
            std::
            vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                         *)pVar8.second,(value_type *)in_stack_fffffffffffffdb8);
          }
          else {
            std::make_pair<int&,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x1618ca);
            std::make_pair<int,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x1618fe);
            std::make_pair<std::pair<int,int>,std::pair<int,int>>
                      ((pair<int,_int> *)pVar8.second,(pair<int,_int> *)in_stack_fffffffffffffdb8);
            std::
            vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                         *)pVar8.second,(value_type *)in_stack_fffffffffffffdb8);
          }
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)pVar8.second);
          std::make_pair<int&,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x161990);
          local_44 = Station::getBeamIndex((Station *)in_stack_fffffffffffffdb8,pVar8.second);
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)pVar8.second);
          bVar2 = Station::isOpenBeamlet
                            ((Station *)pVar8.first,pVar8.second.second,pVar8.second.first);
          __x = pVar8.second;
          if (bVar2) {
            std::make_pair<int&,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x161a12);
            std::make_pair<int,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x161a46);
            pVar7 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                              ((pair<int,_int> *)pVar8.second,
                               (pair<int,_int> *)in_stack_fffffffffffffdb8);
            in_stack_fffffffffffffde0 = pVar7.second;
            std::
            vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                         *)pVar8.second,(value_type *)in_stack_fffffffffffffdb8);
          }
          else {
            in_stack_fffffffffffffdd8 =
                 std::make_pair<int&,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x161ac6);
            std::make_pair<int,int&>((int *)in_stack_fffffffffffffdb8,(int *)0x161afa);
            pVar8 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                              ((pair<int,_int> *)__x,(pair<int,_int> *)in_stack_fffffffffffffdb8);
            std::
            vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                         *)pVar8.second,(value_type *)in_stack_fffffffffffffdb8);
          }
        }
        local_78 = local_78 + 1;
      }
      local_74 = local_74 + 1;
    }
    std::advance<std::_List_iterator<imrt::Station*>,int>
              ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdd8.second);
  }
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::begin((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *)in_stack_fffffffffffffdb8);
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::end((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
         *)in_stack_fffffffffffffdb8);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            ((__normal_iterator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )in_stack_fffffffffffffde0,
             (__normal_iterator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )in_stack_fffffffffffffdd8);
  local_31 = 1;
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x161c2b);
  return in_RDI;
}

Assistant:

vector < pair<pair<int, int>, pair<int, int>> > ApertureILS::getShuffledApertureNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  vector<pair< pair<int,int> , pair<int, int> >> a_list;
  list<Station*>::iterator st;
  int beamlet;
  st = stations.begin();

  pair <int,int> pattern;
  pair <int,int> active;
  
  for (int s = 0; s < stations.size(); s++) {
    for (int a = 0; a < (*st)->getNbApertures(); a++){
      for (int k = 0; k< (*st)->collimator.getXdim() ; k++){
        //One pair -k (-row) for closing aperture
        //One pair (k) (row) for opening aperture
        pattern = (*st)->getApertureShape(a, k);
        active = (*st)->collimator.getActiveRange(k, (*st)->getAngle());
        if (active.first == -1) continue;
        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.first));
        if((*st)->isOpenBeamlet(beamlet, a))
           a_list.push_back(make_pair(make_pair(s,a) , make_pair(-1,beamlet)));
        else 
            a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));

        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.second));
        if((*st)->isOpenBeamlet(beamlet, a))
           a_list.push_back(make_pair(make_pair(s,a) , make_pair(-2,beamlet)));
        else 
           a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
      }
    }
    std::advance(st,1);
  }
  std::random_shuffle(a_list.begin(), a_list.end());
  return(a_list);
}